

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O2

VectorData *
find_max_min_mean<signed_char>
          (VectorData *__return_storage_ptr__,
          vector<signed_char,_std::allocator<signed_char>_> *numbers)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  
  pcVar2 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar4 = (double)(int)*pcVar2;
  __return_storage_ptr__->max = dVar4;
  pcVar1 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pcVar1 - (long)pcVar2;
  dVar8 = dVar4;
  dVar6 = dVar4;
  if (lVar3 != 1) {
    while (dVar5 = dVar8, pcVar2 = pcVar2 + 1, pcVar2 != pcVar1) {
      dVar8 = (double)(int)*pcVar2;
      dVar9 = dVar8;
      if (dVar8 <= dVar6) {
        dVar9 = dVar6;
      }
      dVar4 = dVar4 + dVar8;
      dVar6 = dVar9;
      if (dVar5 <= dVar8) {
        dVar8 = dVar5;
      }
    }
    __return_storage_ptr__->max = dVar6;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    __return_storage_ptr__->min = dVar5;
    __return_storage_ptr__->mean =
         dVar4 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->mean = dVar4;
  __return_storage_ptr__->min = dVar4;
  return __return_storage_ptr__;
}

Assistant:

VectorData find_max_min_mean(const std::vector<Number>& numbers)
{
	VectorData vd;

	auto it = numbers.begin();
	vd.max = *it;
	vd.min = *it;
	double sum = *it;

	if (numbers.size() == 1)
	{
		vd.min = vd.mean = vd.max;
		return vd;
	}

	for (it = it + 1; it != numbers.end(); ++it)
	{
		if (vd.max < *it)
			vd.max = *it;
		if (vd.min > * it)
			vd.min = *it;
		sum += *it;
	}

	vd.mean = sum / numbers.size();
	return vd;
}